

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

shared_ptr<duckdb::ParquetKeys,_true> __thiscall
duckdb::shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetKeys>
          (duckdb *this,shared_ptr<duckdb::ObjectCacheEntry,_true> *src)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar2;
  shared_ptr<duckdb::ParquetKeys,_true> sVar3;
  
  peVar1 = (src->internal).super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (src->internal).super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(element_type **)this = peVar1;
    *(undefined8 *)(this + 8) = 0;
    goto LAB_01cf3e3c;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded != '\0';
    *(element_type **)this = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = this_00;
    if (bVar2) goto LAB_01cf3e34;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    *(element_type **)this = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = this_00;
LAB_01cf3e34:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  in_RDX._M_pi = extraout_RDX;
LAB_01cf3e3c:
  sVar3.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ParquetKeys,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<TGT> shared_ptr_cast(shared_ptr<SRC> src) { // NOLINT: mimic std style
	return shared_ptr<TGT>(std::static_pointer_cast<TGT, SRC>(src.internal));
}